

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

ssize_t __thiscall
GGSock::Communicator::send(Communicator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> _Var1;
  int iVar2;
  undefined8 unaff_RBP;
  ulong uVar3;
  TBufferSize size;
  string msg;
  undefined2 local_56;
  int local_54;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_56 = (undefined2)__fd;
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&(_Var1._M_head_impl)->mutexSend);
  if (iVar2 == 0) {
    if ((_Var1._M_head_impl)->isConnected == false) {
      uVar3 = 0;
    }
    else {
      local_48 = 0;
      local_40 = 0;
      local_54 = (int)__n + 6;
      local_50 = &local_40;
      std::__cxx11::string::reserve((ulong)&local_50);
      std::__cxx11::string::replace((ulong)&local_50,local_48,(char *)0x0,(ulong)&local_54);
      std::__cxx11::string::replace((ulong)&local_50,local_48,(char *)0x0,(ulong)&local_56);
      std::__cxx11::string::replace((ulong)&local_50,local_48,(char *)0x0,(ulong)__buf);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(_Var1._M_head_impl)->ringBufferSend +
                 (long)(_Var1._M_head_impl)->rbEnd * 0x20),(string *)&local_50);
      iVar2 = 0;
      if ((_Var1._M_head_impl)->rbEnd < 0x7f) {
        iVar2 = (_Var1._M_head_impl)->rbEnd + 1;
      }
      (_Var1._M_head_impl)->rbEnd = iVar2;
      uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar2 != (_Var1._M_head_impl)->rbHead);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&(_Var1._M_head_impl)->mutexSend);
    return uVar3 & 0xffffffff;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool Communicator::send(TMessageType type, const char * dataBuffer, TBufferSize dataSize) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutexSend);

        if (data.isConnected == false) return false;

        {
            std::string msg;
            TBufferSize size = ::MessageHeader::getSizeInBytes() + dataSize;

            msg.reserve(size);

            msg.append(reinterpret_cast<const char*>(&size), reinterpret_cast<const char*>(&size)+sizeof(size));
            msg.append(reinterpret_cast<const char*>(&type), reinterpret_cast<const char*>(&type)+sizeof(type));
            msg.append(dataBuffer, dataBuffer + dataSize);

            if (data.addMessageToSend(std::move(msg)) == false) {
                // error, send buffer is full
                return false;
            }
        }

        return true;
    }